

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

size_t sets_union<320ul,std::array<unsigned_long,5ul>>
                 (vector<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_> *binary_sets,
                 array<unsigned_long,_5UL> *c)

{
  pointer pbVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [24];
  value_type x;
  undefined1 auVar9 [24];
  
  pbVar1 = (binary_sets->
           super__Vector_base<std::bitset<320UL>,_std::allocator<std::bitset<320UL>_>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar8 = x._40_24_;
  x.super__Base_bitset<5UL>._M_w[4] = pbVar1[c->_M_elems[0]].super__Base_bitset<5UL>._M_w[4];
  auVar9 = auVar8;
  _x = CONCAT2440(auVar9,x.super__Base_bitset<5UL>._M_w);
  lVar3 = 0;
  x.super__Base_bitset<5UL>._M_w._0_32_ =
       *(undefined1 (*) [32])pbVar1[c->_M_elems[0]].super__Base_bitset<5UL>._M_w;
  do {
    lVar2 = lVar3 + 1;
    auVar6 = vmovdqu64_avx512f(_x);
    lVar3 = lVar3 + 1;
    auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(pbVar1 + c->_M_elems[lVar2]));
    auVar6 = vporq_avx512f(ZEXT4064(auVar6._0_40_),ZEXT4064(auVar7._0_40_));
    _x = vmovdqu64_avx512f(auVar6);
  } while (lVar3 != 4);
  auVar6 = vmovdqu64_avx512f(_x);
  auVar6 = vpopcntq_avx512_vpopcntdq(ZEXT4064(auVar6._0_40_));
  auVar7 = vmovdqa64_avx512f(auVar6);
  auVar5 = vextracti64x4_avx512f(ZEXT4064(CONCAT832(auVar7._32_8_,ZEXT1632(ZEXT816(0)))),1);
  auVar5 = vpaddq_avx2(auVar6._0_32_,auVar5);
  auVar4 = vpmovqb_avx512vl(auVar5);
  auVar4 = vpsadbw_avx(ZEXT416(auVar4._0_4_),(undefined1  [16])0x0);
  return auVar4._0_8_;
}

Assistant:

size_t sets_union(const std::vector<std::bitset<n_entities>>& binary_sets, const Collection& c)
{
    auto x = binary_sets[c[0]];
    for (size_t i = 1; i < c.size(); ++i)
        x |= binary_sets[c[i]];
    return x.count();
}